

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMemCheckHandler::TestOutputFileNames
          (cmCTestMemCheckHandler *this,int test,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_5e0 [32];
  undefined1 local_5c0 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_448 [8];
  string log_1;
  string local_420 [32];
  undefined1 local_400 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_288 [8];
  string log;
  Glob g;
  size_type pos;
  string ofile;
  ostringstream local_1b8 [8];
  ostringstream stream;
  string local_40 [8];
  string index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  int test_local;
  cmCTestMemCheckHandler *this_local;
  
  index.field_2._8_8_ = files;
  std::__cxx11::string::string(local_40);
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::ostream::operator<<(local_1b8,test);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(local_40,(string *)(ofile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(ofile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&pos,(string *)&this->MemoryTesterOutputFile);
  uVar3 = std::__cxx11::string::find((char *)&pos,0x98cf69);
  std::__cxx11::string::replace((ulong)&pos,uVar3,(string *)0x2);
  if ((this->LogWithPID & 1U) == 0) {
    bVar2 = cmsys::SystemTools::FileExists((string *)&pos);
    if (!bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                     "Cannot find memory tester output file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
      poVar5 = std::operator<<((ostream *)local_5c0,(string *)local_448);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x44a,pcVar6,false);
      std::__cxx11::string::~string(local_5e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)local_448);
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)&pos,".*");
    cmsys::Glob::Glob((Glob *)((long)&log.field_2 + 8));
    cmsys::Glob::FindFiles((Glob *)((long)&log.field_2 + 8),(string *)&pos,(GlobMessages *)0x0);
    pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&log.field_2 + 8));
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvVar4);
    if (bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     "Cannot find memory tester output file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
      poVar5 = std::operator<<((ostream *)local_400,(string *)local_288);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x442,pcVar6,false);
      std::__cxx11::string::~string(local_420);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)local_288);
    }
    else {
      pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&log.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)index.field_2._8_8_,pvVar4);
    }
    log_1.field_2._13_3_ = 0;
    log_1.field_2._M_local_buf[0xc] = !bVar2;
    cmsys::Glob::~Glob((Glob *)((long)&log.field_2 + 8));
    if (log_1.field_2._12_4_ != 0) goto LAB_001c480c;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)index.field_2._8_8_,(value_type *)&pos);
  log_1.field_2._12_4_ = 0;
LAB_001c480c:
  std::__cxx11::string::~string((string *)&pos);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmCTestMemCheckHandler::TestOutputFileNames(
  int test, std::vector<std::string>& files)
{
  std::string index;
  std::ostringstream stream;
  stream << test;
  index = stream.str();
  std::string ofile = this->MemoryTesterOutputFile;
  std::string::size_type pos = ofile.find("??");
  ofile.replace(pos, 2, index);
  if (this->LogWithPID) {
    ofile += ".*";
    cmsys::Glob g;
    g.FindFiles(ofile);
    if (g.GetFiles().empty()) {
      std::string log = "Cannot find memory tester output file: " + ofile;
      cmCTestLog(this->CTest, WARNING, log << std::endl);
      ofile.clear();
    } else {
      files = g.GetFiles();
      return;
    }
  } else if (!cmSystemTools::FileExists(ofile)) {
    std::string log = "Cannot find memory tester output file: " + ofile;
    cmCTestLog(this->CTest, WARNING, log << std::endl);
    ofile.clear();
  }
  files.push_back(std::move(ofile));
}